

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exhaustive_tester.cc
# Opt level: O0

void __thiscall re2::ExhaustiveTester::HandleRegexp(ExhaustiveTester *this,string *const_regexp)

{
  bool bVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  StringPiece *text;
  int local_a0;
  int bad_inputs;
  undefined1 local_88 [8];
  Tester tester;
  string local_58 [32];
  string local_38 [8];
  string regexp;
  string *const_regexp_local;
  ExhaustiveTester *this_local;
  
  this->regexps_ = this->regexps_ + 1;
  std::__cxx11::string::string(local_38,(string *)const_regexp);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    uVar3 = std::__cxx11::string::c_str();
    uVar4 = std::__cxx11::string::c_str();
    StringPrintf_abi_cxx11_((char *)local_58,uVar3,uVar4);
    std::__cxx11::string::operator=(local_38,local_58);
    std::__cxx11::string::~string(local_58);
  }
  if ((FLAGS_show_regexps & 1) != 0) {
    uVar3 = std::__cxx11::string::c_str();
    printf("\r%s",uVar3);
    fflush(_stdout);
  }
  StringPiece::StringPiece((StringPiece *)&bad_inputs,(string *)local_38);
  Tester::Tester((Tester *)local_88,(StringPiece *)&bad_inputs);
  bVar1 = Tester::error((Tester *)local_88);
  if (!bVar1) {
    StringGenerator::Reset(&this->strgen_);
    StringGenerator::GenerateNULL(&this->strgen_);
    if ((this->randomstrings_ & 1U) != 0) {
      StringGenerator::Random(&this->strgen_,this->stringseed_,this->stringcount_);
    }
    local_a0 = 0;
    do {
      do {
        bVar1 = StringGenerator::HasNext(&this->strgen_);
        if (!bVar1) goto LAB_0014a569;
        this->tests_ = this->tests_ + 1;
        text = StringGenerator::Next(&this->strgen_);
        bVar1 = Tester::TestInput((Tester *)local_88,text);
      } while (bVar1);
      this->failures_ = this->failures_ + 1;
      local_a0 = local_a0 + 1;
    } while (local_a0 < FLAGS_max_bad_regexp_inputs);
  }
LAB_0014a569:
  Tester::~Tester((Tester *)local_88);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void ExhaustiveTester::HandleRegexp(const string& const_regexp) {
  regexps_++;
  string regexp = const_regexp;
  if (!topwrapper_.empty())
    regexp = StringPrintf(topwrapper_.c_str(), regexp.c_str());

  if (FLAGS_show_regexps) {
    printf("\r%s", regexp.c_str());
    fflush(stdout);
  }

  if (LOGGING) {
    // Write out test cases and answers for use in testing
    // other implementations, such as Go's regexp package.
    if (randomstrings_)
      LOG(ERROR) << "Cannot log with random strings.";
    if (regexps_ == 1) {  // first
      printf("strings\n");
      strgen_.Reset();
      while (strgen_.HasNext())
        printf("%s\n", escape(strgen_.Next()));
      printf("regexps\n");
    }
    printf("%s\n", escape(regexp));

    RE2 re(regexp);
    RE2::Options longest;
    longest.set_longest_match(true);
    RE2 relongest(regexp, longest);
    int ngroup = re.NumberOfCapturingGroups()+1;
    StringPiece* group = new StringPiece[ngroup];

    strgen_.Reset();
    while (strgen_.HasNext()) {
      StringPiece input = strgen_.Next();
      PrintResult(re, input, RE2::ANCHOR_BOTH, group, ngroup);
      printf(";");
      PrintResult(re, input, RE2::UNANCHORED, group, ngroup);
      printf(";");
      PrintResult(relongest, input, RE2::ANCHOR_BOTH, group, ngroup);
      printf(";");
      PrintResult(relongest, input, RE2::UNANCHORED, group, ngroup);
      printf("\n");
    }
    delete[] group;
    return;
  }

  Tester tester(regexp);
  if (tester.error())
    return;

  strgen_.Reset();
  strgen_.GenerateNULL();
  if (randomstrings_)
    strgen_.Random(stringseed_, stringcount_);
  int bad_inputs = 0;
  while (strgen_.HasNext()) {
    tests_++;
    if (!tester.TestInput(strgen_.Next())) {
      failures_++;
      if (++bad_inputs >= FLAGS_max_bad_regexp_inputs)
        break;
    }
  }
}